

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

double __thiscall
QHybrid::ComputeRecursively(QHybrid *this,size_t time_step,LIndex jaohI,Index lastJAI)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  shared_count sVar5;
  int iVar6;
  Index IVar7;
  PlanningUnitMADPDiscrete *pPVar8;
  JointBeliefInterface *pJVar9;
  long lVar10;
  BayesianGameIdenticalPayoff *this_00;
  long *plVar11;
  size_t nrAgents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes;
  sp_counted_base *psVar12;
  LIndex i;
  undefined8 *puVar13;
  ulong uVar14;
  uint lastJAI_00;
  ulong uVar15;
  ulong uVar16;
  element_type *peVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  BeliefIteratorGeneric it;
  sp_counted_base *local_1f8;
  double local_1f0;
  ulong local_1e0;
  element_type *local_1d8;
  shared_count sStack_1d0;
  ulong local_1c8;
  Index local_1bc;
  shared_ptr<BayesianGameIdenticalPayoff> local_1b8;
  LIndex local_1a0;
  SparseVector *local_198;
  element_type *local_190;
  ulong local_188;
  size_t local_180;
  size_t local_178;
  ulong local_170;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> local_168;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_178 = this->_m_horizonFirstTimeSteps;
  local_1a0 = jaohI;
  if ((local_178 == time_step) && (this->_m_QlastTimeSteps == (QFunctionJointBeliefInterface *)0x0))
  {
    lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    pPVar8 = (PlanningUnitMADPDiscrete *)
             (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) + 0x60
                         ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
    pJVar9 = PlanningUnitMADPDiscrete::GetJointBeliefInterface(pPVar8,local_1a0);
    (**(code **)(*(long *)(&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8)) + 0x98))
              (&local_168,&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8));
    local_1f0 = 0.0;
    do {
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      iVar6 = (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_referredBG.px)->super_BayesianGameBase).
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])();
      uVar16 = (**(code **)(**(long **)(lVar10 + 0x330) + 0xc0))
                         (*(long **)(lVar10 + 0x330),iVar6,lastJAI);
      uVar14 = uVar16;
      (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
          super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
          _m_referredBG.px)->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[2])();
      iVar6 = (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_referredBG.px)->super_BayesianGameBase).
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[4])();
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_1f0;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar14;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar16;
      auVar4 = vfmadd231sd_fma(auVar19,auVar28,auVar1);
      local_1f0 = auVar4._0_8_;
    } while ((char)iVar6 != '\0');
    (**(code **)((long)*pJVar9 + 8))(pJVar9);
    local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
    super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
    _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR__BeliefIteratorGeneric_0059cb30;
    if ((sp_counted_base *)
        local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
        super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver._m_referredBG.
        px != (sp_counted_base *)0x0) {
      (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
          super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
          _m_referredBG.px)->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[1])();
    }
  }
  else {
    local_1d8 = (element_type *)0x0;
    sStack_1d0.pi_ = (sp_counted_base *)0x0;
    if (this->_m_QheurTypeFirstTS == eQBG) {
      this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      plVar11 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                              lVar10) + 0x60))
                                  (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      nrAgents = (**(code **)(*plVar11 + 0x30))(plVar11);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  (**(code **)(**(long **)(lVar10 + 0x30) + 0x58))();
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      nrTypes = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(**(long **)(lVar10 + 0x30) + 0xb8))();
      BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
                (this_00,nrAgents,nrActions,nrTypes,false);
      boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr<BayesianGameIdenticalPayoff>
                (&local_1b8,this_00);
      sVar5.pi_ = local_1b8.pn.pi_;
      local_1d8 = local_1b8.px;
      local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver._m_referredBG.px
           = (element_type *)sStack_1d0.pi_;
      local_1b8.px = (element_type *)0x0;
      local_1b8.pn.pi_ = (sp_counted_base *)0x0;
      sStack_1d0.pi_ = sVar5.pi_;
      local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
      _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)0x0;
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_referredBG);
      boost::detail::shared_count::~shared_count(&local_1b8.pn);
    }
    lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    local_1bc = lastJAI;
    lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) + 0x60
                         ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
    plVar11 = *(long **)(lVar10 + 0x330);
    local_188 = (**(code **)(*(long *)((long)plVar11 + *(long *)(*plVar11 + -0xb0)) + 0x70))
                          ((long)plVar11 + *(long *)(*plVar11 + -0xb0));
    local_180 = time_step + 1;
    local_1f0 = 0.0;
    local_1f8 = (sp_counted_base *)0x0;
    local_198 = (SparseVector *)&PTR__BeliefIteratorGeneric_0059cb30;
    while( true ) {
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      psVar12 = (sp_counted_base *)(**(code **)(**(long **)(lVar10 + 0x30) + 200))();
      if (psVar12 <= local_1f8) break;
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      pPVar8 = (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      i = PlanningUnitMADPDiscrete::GetSuccessorJAOHI(pPVar8,local_1a0,local_1bc,(Index)local_1f8);
      IVar7 = Globals::CastLIndexToIndex(i);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      pPVar8 = (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      uVar14 = (ulong)IVar7;
      pJVar9 = PlanningUnitMADPDiscrete::GetJointBeliefInterface(pPVar8,uVar14);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      pPVar8 = (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      peVar17 = (element_type *)PlanningUnitMADPDiscrete::GetJAOHProbGivenPred(pPVar8,uVar14);
      if (1e-12 <= (double)peVar17) {
        local_190 = peVar17;
        if (this->_m_QheurTypeFirstTS == eQBG) {
          local_1b8.px = peVar17;
          if ((local_1d8->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              _m_useSparse == true) {
            local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
            super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
            _vptr_BayesianGameIdenticalPayoffSolver =
                 (_func_int **)
                 &(local_1d8->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                  _m_jTypeProbsSparse;
            local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
            super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
            _m_referredBG.px = (element_type *)local_1f8;
            boost::numeric::ublas::
            sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
            ::set((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                   *)&local_168,(value_type *)&local_1b8);
          }
          else {
            (local_1d8->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            _m_jTypeProbs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)local_1f8] = (double)peVar17;
          }
        }
        lastJAI_00 = 0;
        local_1c8 = 0xffefffffffffffff;
        while( true ) {
          lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10)
                               + 0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
          uVar16 = (**(code **)(**(long **)(lVar10 + 0x30) + 0x68))();
          uVar15 = (ulong)lastJAI_00;
          if (uVar16 <= uVar15) break;
          if (local_178 == time_step) {
            auVar26._0_8_ =
                 (**(code **)((long)*this->_m_QlastTimeSteps + 0x70))
                           (this->_m_QlastTimeSteps,pJVar9,0,uVar15);
            auVar26._8_56_ = extraout_var;
            auVar20 = auVar26._0_16_;
          }
          else {
            (**(code **)(*(long *)(&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8)) + 0x98))
                      (&local_168,&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8));
            local_1e0 = 0;
            do {
              lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
              lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                             lVar10) + 0x60))
                                 (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
              iVar6 = (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                          super_BGIP_IncrementalSolverInterface.
                          super_BayesianGameIdenticalPayoffSolver._m_referredBG.px)->
                        super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
                        super_Interface_ProblemToPolicyDiscrete.
                        _vptr_Interface_ProblemToPolicyDiscrete[3])();
              uVar18 = (**(code **)(**(long **)(lVar10 + 0x330) + 0xc0))
                                 (*(long **)(lVar10 + 0x330),iVar6,uVar15);
              uVar16 = uVar18;
              (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_referredBG.px)->super_BayesianGameBase).
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[2])();
              local_170 = uVar16;
              iVar6 = (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                          super_BGIP_IncrementalSolverInterface.
                          super_BayesianGameIdenticalPayoffSolver._m_referredBG.px)->
                        super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
                        super_Interface_ProblemToPolicyDiscrete.
                        _vptr_Interface_ProblemToPolicyDiscrete[4])();
              auVar21._8_8_ = 0;
              auVar21._0_8_ = local_1e0;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = local_170;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar18;
              auVar4 = vfmadd231sd_fma(auVar21,auVar29,auVar2);
              auVar23._0_8_ = auVar4._0_8_;
              local_1e0 = auVar23._0_8_;
            } while ((char)iVar6 != '\0');
            auVar27._0_8_ = ComputeRecursively(this,local_180,uVar14,lastJAI_00);
            auVar27._8_56_ = extraout_var_00;
            auVar22 = auVar27._0_16_;
            local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
            super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
            _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)local_198;
            if ((sp_counted_base *)
                local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                _m_referredBG.px != (sp_counted_base *)0x0) {
              (*((local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_referredBG.px)->super_BayesianGameBase).
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[1])();
              auVar22._8_8_ = 0;
              auVar22._0_8_ = auVar27._0_8_;
            }
            auVar23._8_8_ = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_188;
            auVar20 = vfmadd132sd_fma(auVar22,auVar23,auVar3);
          }
          if (uVar14 < this->_m_nrJAOHinFirstTS) {
            (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_
            [(this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ * uVar14 + uVar15] =
                 auVar20._0_8_;
          }
          if (this->_m_QheurTypeFirstTS == eQBG) {
            (*(local_1d8->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                      (auVar20._0_8_,local_1d8->_m_utilFunction,local_1f8,uVar15);
            auVar20._8_8_ = 0;
          }
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_1c8;
          auVar4 = vmaxsd_avx(auVar20,auVar24);
          local_1c8 = auVar4._0_8_;
          lastJAI_00 = lastJAI_00 + 1;
        }
        if (pJVar9 != (JointBeliefInterface *)0x0) {
          (**(code **)((long)*pJVar9 + 8))(pJVar9);
        }
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_1f0;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_1c8;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_190;
        auVar4 = vfmadd231sd_fma(auVar25,auVar30,auVar4);
        local_1f0 = auVar4._0_8_;
      }
      local_1f8 = (sp_counted_base *)(ulong)((Index)local_1f8 + 1);
    }
    if (this->_m_QheurTypeFirstTS != eQPOMDP) {
      if (this->_m_QheurTypeFirstTS != eQBG) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar13 = &PTR__E_0059bd80;
        puVar13[1] = puVar13 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar13 + 1),"QHybrid: invalid Qheuristic for first time steps","");
        __cxa_throw(puVar13,&E::typeinfo,E::~E);
      }
      local_1b8.px = local_1d8;
      local_1b8.pn.pi_ = sStack_1d0.pi_;
      if (sStack_1d0.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_1d0.pi_)->use_count_ = (sStack_1d0.pi_)->use_count_ + 1;
        UNLOCK();
      }
      BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
                ((BayesianGameIdenticalPayoffSolver *)&local_168,
                 (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&local_1b8,1);
      local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface._m_nrSolutionsReturned = 0;
      local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
      _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR_InitDeadline_0059cd00;
      local_168._m_verbosity = 0;
      local_168._m_deadlineInSeconds = 0;
      local_168._m_solved = false;
      local_168._m_CBGupperBound = 1.79769313486232e+308;
      boost::detail::shared_count::~shared_count(&local_1b8.pn);
      local_1f0 = BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve(&local_168);
      local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
      _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR_InitDeadline_0059e988;
      BGIPSolution::~BGIPSolution
                (&local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_solution);
      boost::detail::shared_count::~shared_count
                (&local_168.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
                  super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
                  _m_referredBG.pn);
    }
    boost::detail::shared_count::~shared_count(&sStack_1d0);
  }
  return local_1f0;
}

Assistant:

double QHybrid::ComputeRecursively(size_t time_step,
                                   LIndex jaohI,
                                   Index lastJAI)
{
    bool last_t = false;
    if( time_step == _m_horizonFirstTimeSteps )
        last_t = true;

    // we don't have a vector-based representation, so at the last
    // time step just return the immediate reward
    if(last_t && !_m_QlastTimeSteps)
    {
        double Q=0.0;
        JointBeliefInterface* jbi =
            GetPU()->GetJointBeliefInterface(jaohI);
        BeliefIteratorGeneric it=jbi->GetIterator();
        do
        {
            double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), lastJAI);
            double prob_s = it.GetProbability();
            Q += r_s_ja * prob_s;
        } while(it.Next());
        delete jbi;
        return(Q);
    }

    BGIP_sharedPtr bg_time_step;
    if(_m_QheurTypeFirstTS==eQBG)
        bg_time_step=BGIP_sharedPtr(
            new BayesianGameIdenticalPayoff(
                GetPU()->GetNrAgents(), 
                GetPU()->GetNrActions(),
                GetPU()->GetNrObservations()));
            
    double Vpomdp = 0.0;
    double discount = GetPU()->GetDiscount();

    for(Index newJOI=0; newJOI < GetPU()->GetNrJointObservations(); newJOI++)
    {
        Index new_jaohI = CastLIndexToIndex(
            GetPU()->GetSuccessorJAOHI(jaohI, lastJAI, newJOI));

        //get the new joint belief at this time-step resulting from lastJAI, 
        //newJOI...(the true prob. dist over states for the actions and obser-
        //vations as given by the history < jaoh, lastJA, newJOI > )
        
        JointBeliefInterface* new_jbi =
            GetPU()->GetJointBeliefInterface(new_jaohI);
        double Po_ba = GetPU()->GetJAOHProbGivenPred(new_jaohI);

        // if the probability of this observation occurring is zero,
        // the belief is not defined, and don't have to consider this
        // part of the tree anymore
        if(Po_ba<PROB_PRECISION)
            continue;

        if(_m_QheurTypeFirstTS==eQBG)
            bg_time_step->SetProbability(newJOI, Po_ba);

        //for all joint actions newJA
        double maxQ = -DBL_MAX;
        for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
        {
            double Q=0.0;
            if(last_t)
                Q = _m_QlastTimeSteps->GetQ(*new_jbi, 0, newJAI);
            else
            {
                //calculate R(joah',newJA) - expected immediate reward for time_step
                double exp_imm_R = 0.0;
                BeliefIteratorGeneric it=new_jbi->GetIterator();
                do
                {
                    double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                    double prob_s = it.GetProbability();
                    exp_imm_R += r_s_ja * prob_s;
                } while(it.Next());

                double exp_fut_R = ComputeRecursively(time_step+1, new_jaohI, newJAI);
                Q = exp_imm_R + discount * exp_fut_R;
            }
            if(new_jaohI<_m_nrJAOHinFirstTS)
                _m_QValuesFirstTimeSteps(new_jaohI,newJAI)=Q;
            if(Q > maxQ)
                maxQ = Q;
            if(_m_QheurTypeFirstTS==eQBG)
                bg_time_step->SetUtility(newJOI, newJAI, Q);
        }//end for newJAI
        
        //joint belief no longer needed:
        delete new_jbi;

        Vpomdp += Po_ba * maxQ;

    }//end for newJOI

    switch(_m_QheurTypeFirstTS)
    {
    case eQBG:
    {
        //solve this bayesian game, asking for only 1 solution
        int BGsolverVerbose=0;
        int nrSolutionsWanted=1;       
#if USE_BNB_SOLVER       
        BGIP_SolverBranchAndBound<JointPolicyPureVector> bgs(bg_time_step,
                                                             BGsolverVerbose,nrSolutionsWanted,
                                                             false,
                                                             BGIP_BnB::DescendingProbability,
                                                             false); // at least for boxPushing CCI was slower
#else
        BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs(bg_time_step,BGsolverVerbose,nrSolutionsWanted);
#endif
        double Vbg = bgs.Solve();
        return(Vbg);
    }
    case eQPOMDP:
    {
        return(Vpomdp);
    }
    default:
        throw(E("QHybrid: invalid Qheuristic for first time steps"));
    }
    return(42);
}